

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O1

void renderScene(void)

{
  int iVar1;
  float in_XMM0_Da;
  
  loadSphereDataBuffers(in_XMM0_Da);
  if (g_framebuffer.flags.progressive == true) {
    renderSceneProgressive();
    return;
  }
  iVar1 = g_framebuffer.samplesPerPixel / g_framebuffer.samplesPerPass +
          (uint)(g_framebuffer.samplesPerPixel / g_framebuffer.samplesPerPass == 0);
  if (0 < iVar1) {
    do {
      loadRandomBuffer();
      renderSceneProgressive();
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void renderScene()
{
    loadSphereDataBuffers(1.f);
    if (g_framebuffer.flags.progressive) {
        renderSceneProgressive();
    } else {
        int passCnt = g_framebuffer.samplesPerPixel
                    / g_framebuffer.samplesPerPass;

        if (!passCnt) passCnt = 1;
        for (int i = 0; i < passCnt; ++i) {
            loadRandomBuffer();
            renderSceneProgressive();
        }
    }
}